

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::Aggregate::_InternalSerialize
          (Aggregate *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  Aggregate *pAVar1;
  FileOptions *value;
  AggregateMessageSet *value_00;
  Any *value_01;
  string_view s;
  bool bVar2;
  int32_t value_02;
  int iVar3;
  uint32_t *puVar4;
  char *data;
  UnknownFieldSet *unknown_fields;
  string_view local_48;
  string *local_38;
  string *_s;
  Aggregate *pAStack_28;
  uint32_t cached_has_bits;
  Aggregate *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  Aggregate *this_local;
  
  _s._4_4_ = 0;
  pAStack_28 = this;
  this_ = (Aggregate *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar4 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  pAVar1 = this_;
  _s._4_4_ = *puVar4;
  if ((_s._4_4_ & 0x20) != 0) {
    value_02 = _internal_i(pAStack_28);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                             ((EpsCopyOutputStream *)pAVar1,value_02,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 1) != 0) {
    local_38 = _internal_s_abi_cxx11_(pAStack_28);
    data = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"proto2_unittest.Aggregate.s");
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (data,iVar3,SERIALIZE,local_48);
    pAVar1 = this_;
    s = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pAVar1,2,s,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 2) != 0) {
    pAVar1 = (pAStack_28->field_0)._impl_.sub_;
    iVar3 = GetCachedSize((pAStack_28->field_0)._impl_.sub_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (3,(MessageLite *)pAVar1,iVar3,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  if ((_s._4_4_ & 4) != 0) {
    value = (pAStack_28->field_0)._impl_.file_;
    iVar3 = google::protobuf::FileOptions::GetCachedSize((pAStack_28->field_0)._impl_.file_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (4,(MessageLite *)value,iVar3,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  if ((_s._4_4_ & 8) != 0) {
    value_00 = (pAStack_28->field_0)._impl_.mset_;
    iVar3 = AggregateMessageSet::GetCachedSize((pAStack_28->field_0)._impl_.mset_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (5,(MessageLite *)value_00,iVar3,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  if ((_s._4_4_ & 0x10) != 0) {
    value_01 = (pAStack_28->field_0)._impl_.any_;
    iVar3 = google::protobuf::Any::GetCachedSize((pAStack_28->field_0)._impl_.any_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (6,(MessageLite *)value_01,iVar3,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(pAStack_28->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pAStack_28->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL Aggregate::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const Aggregate& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.Aggregate)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional int32 i = 1;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_i(), target);
  }

  // optional string s = 2;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_s();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.Aggregate.s");
    target = stream->WriteStringMaybeAliased(2, _s, target);
  }

  // optional .proto2_unittest.Aggregate sub = 3;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        3, *this_._impl_.sub_, this_._impl_.sub_->GetCachedSize(), target,
        stream);
  }

  // optional .google.protobuf.FileOptions file = 4;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        4, *this_._impl_.file_, this_._impl_.file_->GetCachedSize(), target,
        stream);
  }

  // optional .proto2_unittest.AggregateMessageSet mset = 5;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        5, *this_._impl_.mset_, this_._impl_.mset_->GetCachedSize(), target,
        stream);
  }

  // optional .google.protobuf.Any any = 6;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        6, *this_._impl_.any_, this_._impl_.any_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.Aggregate)
  return target;
}